

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

uint16_t ucnv_countAliases_63(char *alias,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint32_t uVar2;
  
  UVar1 = haveAliasData(pErrorCode);
  if (UVar1 != '\0') {
    if (alias == (char *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if (*alias != '\0') {
      uVar2 = findConverter(alias,(UBool *)0x0,pErrorCode);
      if (gMainTable.converterListSize <= uVar2) {
        return 0;
      }
      if ((ulong)gMainTable.taggedAliasArray
                 [(gMainTable.tagListSize - 1) * gMainTable.converterListSize + uVar2] != 0) {
        return gMainTable.taggedAliasLists
               [gMainTable.taggedAliasArray
                [(gMainTable.tagListSize - 1) * gMainTable.converterListSize + uVar2]];
      }
    }
  }
  return 0;
}

Assistant:

U_CAPI uint16_t U_EXPORT2
ucnv_countAliases(const char *alias, UErrorCode *pErrorCode)
{
    return ucnv_io_countAliases(alias, pErrorCode);
}